

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushUnaryMinus.cpp
# Opt level: O0

ostream * Inferences::operator<<(ostream *out,UMinus *self)

{
  undefined4 *in_RSI;
  ostream *in_RDI;
  ostream *local_8;
  
  switch(*in_RSI) {
  case 0:
    local_8 = std::operator<<(in_RDI,"UMinus::Int");
    break;
  case 1:
    local_8 = std::operator<<(in_RDI,"UMinus::Rat");
    break;
  case 2:
    local_8 = std::operator<<(in_RDI,"UMinus::Real");
    break;
  case 3:
    local_8 = std::operator<<(in_RDI,"UMinus::None");
    break;
  default:
    local_8 = std::operator<<(in_RDI,"UNKNOWN");
  }
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& out, UMinus const& self) {
  switch(self) {
    case UMinus::Int: return out << "UMinus::Int";
    case UMinus::Rat: return out << "UMinus::Rat";
    case UMinus::Real: return out << "UMinus::Real";
    case UMinus::None: return out << "UMinus::None";
    default:
      return out << "UNKNOWN";
  }
  ASSERTION_VIOLATION
}